

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx512.cpp
# Opt level: O3

int __thiscall
ncnn::Gemm_x86_avx512::forward
          (Gemm_x86_avx512 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  pointer pMVar1;
  Mat *this_00;
  size_t sVar2;
  _func_int **pp_Var3;
  void *pvVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  byte bVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  _func_int *p_Var13;
  ulong uVar14;
  uint uVar15;
  Mat *pMVar16;
  Mat *pMVar17;
  int iVar18;
  uint broadcast_type_C;
  int *piVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  ulong uVar23;
  int iVar24;
  uint uVar25;
  int iVar26;
  uint _w;
  int iVar27;
  int iVar28;
  int iVar29;
  size_t sVar30;
  Mat *pMVar31;
  long lVar32;
  ulong uVar33;
  long lVar34;
  bool bVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  int TILE_K;
  ulong local_238;
  Mat *local_230;
  Mat *local_228;
  ulong local_220;
  ulong local_218;
  Mat *local_210;
  ulong local_208;
  int TILE_K_1;
  Mat local_1f8;
  ulong local_1a8;
  ulong local_1a0;
  Mat *local_198;
  ulong local_190;
  Mat local_188;
  Mat local_138;
  int TILE_M;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  int local_d8;
  undefined4 uStack_d4;
  int local_d0;
  Allocator *local_c8;
  int iStack_c0;
  uint uStack_bc;
  int iStack_b8;
  undefined8 uStack_b4;
  ulong local_a8;
  ulong local_a0;
  int TILE_K_2;
  ulong local_90;
  int TILE_N;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  int local_78;
  undefined4 uStack_74;
  int local_70;
  Allocator *local_68;
  int iStack_60;
  uint uStack_5c;
  int iStack_58;
  undefined8 uStack_54;
  ulong local_48;
  ulong local_38;
  
  p_Var13 = this->_vptr_Gemm_x86_avx512[-3];
  iVar12 = *(int *)((long)&(this->CT_data).cstep + (long)(p_Var13 + 4));
  if (*(int *)((long)&(this->CT_data).cstep + (long)p_Var13) == 0) {
    pMVar1 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    iVar18 = *(int *)((long)&(this->CT_data).c + (long)p_Var13);
    if (iVar12 != 0) {
      if (iVar18 == 0) {
        uVar15 = pMVar1->elempack * (&pMVar1->h)[(ulong)(pMVar1->dims == 3) * 2];
      }
      else {
        uVar15 = pMVar1->w;
      }
      goto LAB_004ad8d8;
    }
    if (iVar18 == 0) {
      uVar15 = pMVar1->elempack * (&pMVar1->h)[(ulong)(pMVar1->dims == 3) * 2];
    }
    else {
      uVar15 = pMVar1->w;
    }
    if (*(int *)(&(this->CT_data).field_0x3c + (long)p_Var13) == 0) {
      uVar20 = pMVar1[1].w;
    }
    else {
      uVar20 = pMVar1[1].elempack * (&pMVar1[1].h)[(ulong)(pMVar1[1].dims == 3) * 2];
    }
  }
  else if (iVar12 == 0) {
    pMVar1 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar15 = *(uint *)(&this->field_0xec + (long)p_Var13);
    if (*(int *)(&(this->CT_data).field_0x3c + (long)p_Var13) == 0) {
      uVar20 = pMVar1->w;
    }
    else {
      uVar20 = pMVar1->elempack * (&pMVar1->h)[(ulong)(pMVar1->dims == 3) * 2];
    }
  }
  else {
    uVar15 = *(uint *)(&this->field_0xec + (long)p_Var13);
LAB_004ad8d8:
    uVar20 = *(uint *)(&this->field_0xf0 + (long)p_Var13);
  }
  local_1f8.cstep = 0;
  uVar36 = 0;
  uVar37 = 0;
  local_1f8.data = (void *)0x0;
  local_1f8.refcount._0_4_ = 0;
  local_1f8.refcount._4_4_ = 0;
  local_1f8.elemsize._0_4_ = 0;
  local_1f8.elemsize._4_4_ = 0;
  local_1f8.elempack = 0;
  local_1f8.allocator = (Allocator *)0x0;
  local_1f8.dims = 0;
  local_1f8.w = 0;
  local_1f8.h = 0;
  local_1f8.d = 0;
  local_1f8.c = 0;
  p_Var13 = this->_vptr_Gemm_x86_avx512[-3];
  if (*(int *)(&this->field_0xe8 + (long)p_Var13) == 0) {
    pMVar1 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar32 = (long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)pMVar1;
    iVar12 = *(int *)((long)&(this->CT_data).cstep + (long)(p_Var13 + 4));
    if (*(int *)((long)&(this->CT_data).cstep + (long)p_Var13) == 0) {
      if (iVar12 == 0) {
        bVar35 = true;
        if (lVar32 == 0xd8) {
          local_1f8.data = pMVar1[2].data;
          piVar19 = pMVar1[2].refcount;
          sVar30 = pMVar1[2].elemsize;
          local_1f8.elempack = pMVar1[2].elempack;
          local_1f8.allocator = pMVar1[2].allocator;
          uVar36._0_4_ = pMVar1[2].dims;
          uVar36._4_4_ = pMVar1[2].w;
          uVar37._0_4_ = pMVar1[2].h;
          uVar37._4_4_ = pMVar1[2].d;
          local_1f8.c = pMVar1[2].c;
          local_1f8.cstep = pMVar1[2].cstep;
          if (piVar19 == (int *)0x0) {
            piVar19 = (int *)0x0;
          }
          else {
            LOCK();
            *piVar19 = *piVar19 + 1;
            UNLOCK();
            LOCK();
            *piVar19 = *piVar19 + 1;
            UNLOCK();
            bVar35 = false;
          }
        }
        else {
          local_1f8.cstep = 0;
          local_1f8.c = 0;
          local_1f8.allocator = (Allocator *)0x0;
          local_1f8.elempack = 0;
          sVar30 = 0;
          piVar19 = (int *)0x0;
          local_1f8.data = (void *)0x0;
        }
        local_1f8.refcount._0_4_ = SUB84(piVar19,0);
        local_1f8.refcount._4_4_ = (uint)((ulong)piVar19 >> 0x20);
        local_1f8.elemsize._0_4_ = (int)sVar30;
        local_1f8.elemsize._4_4_ = (undefined4)(sVar30 >> 0x20);
        local_1f8.dims = (int)uVar36;
        local_1f8.w = (int)((ulong)uVar36 >> 0x20);
        local_1f8.h = (int)uVar37;
        local_1f8.d = (int)((ulong)uVar37 >> 0x20);
        if (!bVar35) {
          LOCK();
          *piVar19 = *piVar19 + -1;
          UNLOCK();
          if (*piVar19 == 0) {
            if (local_1f8.allocator == (Allocator *)0x0) goto LAB_004afc8d;
            (*(local_1f8.allocator)->_vptr_Allocator[3])(local_1f8.allocator,local_1f8.data);
          }
        }
      }
      else {
        bVar35 = true;
        if (lVar32 == 0x90) {
          local_1f8.data = pMVar1[1].data;
          piVar19 = pMVar1[1].refcount;
          sVar30 = pMVar1[1].elemsize;
          local_1f8.elempack = pMVar1[1].elempack;
          local_1f8.allocator = pMVar1[1].allocator;
          uVar36._0_4_ = pMVar1[1].dims;
          uVar36._4_4_ = pMVar1[1].w;
          uVar37._0_4_ = pMVar1[1].h;
          uVar37._4_4_ = pMVar1[1].d;
          local_1f8.c = pMVar1[1].c;
          local_1f8.cstep = pMVar1[1].cstep;
          if (piVar19 == (int *)0x0) {
            piVar19 = (int *)0x0;
          }
          else {
            LOCK();
            *piVar19 = *piVar19 + 1;
            UNLOCK();
            LOCK();
            *piVar19 = *piVar19 + 1;
            UNLOCK();
            bVar35 = false;
          }
        }
        else {
          local_1f8.cstep = 0;
          local_1f8.c = 0;
          local_1f8.allocator = (Allocator *)0x0;
          local_1f8.elempack = 0;
          sVar30 = 0;
          piVar19 = (int *)0x0;
          local_1f8.data = (void *)0x0;
        }
        local_1f8.refcount._0_4_ = SUB84(piVar19,0);
        local_1f8.refcount._4_4_ = (uint)((ulong)piVar19 >> 0x20);
        local_1f8.elemsize._0_4_ = (int)sVar30;
        local_1f8.elemsize._4_4_ = (undefined4)(sVar30 >> 0x20);
        local_1f8.dims = (int)uVar36;
        local_1f8.w = (int)((ulong)uVar36 >> 0x20);
        local_1f8.h = (int)uVar37;
        local_1f8.d = (int)((ulong)uVar37 >> 0x20);
        if (!bVar35) {
          LOCK();
          *piVar19 = *piVar19 + -1;
          UNLOCK();
          if (*piVar19 == 0) {
            if (local_1f8.allocator == (Allocator *)0x0) goto LAB_004afc8d;
            (*(local_1f8.allocator)->_vptr_Allocator[3])(local_1f8.allocator,local_1f8.data);
          }
        }
      }
    }
    else if (iVar12 == 0) {
      bVar35 = true;
      if (lVar32 == 0x90) {
        local_1f8.data = pMVar1[1].data;
        piVar19 = pMVar1[1].refcount;
        sVar30 = pMVar1[1].elemsize;
        local_1f8.elempack = pMVar1[1].elempack;
        local_1f8.allocator = pMVar1[1].allocator;
        uVar36._0_4_ = pMVar1[1].dims;
        uVar36._4_4_ = pMVar1[1].w;
        uVar37._0_4_ = pMVar1[1].h;
        uVar37._4_4_ = pMVar1[1].d;
        local_1f8.c = pMVar1[1].c;
        local_1f8.cstep = pMVar1[1].cstep;
        if (piVar19 == (int *)0x0) {
          piVar19 = (int *)0x0;
        }
        else {
          LOCK();
          *piVar19 = *piVar19 + 1;
          UNLOCK();
          LOCK();
          *piVar19 = *piVar19 + 1;
          UNLOCK();
          bVar35 = false;
        }
      }
      else {
        local_1f8.cstep = 0;
        local_1f8.c = 0;
        local_1f8.allocator = (Allocator *)0x0;
        local_1f8.elempack = 0;
        sVar30 = 0;
        piVar19 = (int *)0x0;
        local_1f8.data = (void *)0x0;
      }
      local_1f8.refcount._0_4_ = SUB84(piVar19,0);
      local_1f8.refcount._4_4_ = (uint)((ulong)piVar19 >> 0x20);
      local_1f8.elemsize._0_4_ = (int)sVar30;
      local_1f8.elemsize._4_4_ = (undefined4)(sVar30 >> 0x20);
      local_1f8.dims = (int)uVar36;
      local_1f8.w = (int)((ulong)uVar36 >> 0x20);
      local_1f8.h = (int)uVar37;
      local_1f8.d = (int)((ulong)uVar37 >> 0x20);
      if (!bVar35) {
        LOCK();
        *piVar19 = *piVar19 + -1;
        UNLOCK();
        if (*piVar19 == 0) {
          if (local_1f8.allocator == (Allocator *)0x0) goto LAB_004afc8d;
          (*(local_1f8.allocator)->_vptr_Allocator[3])(local_1f8.allocator,local_1f8.data);
        }
      }
    }
    else {
      bVar35 = true;
      if (lVar32 == 0x48) {
        local_1f8.data = pMVar1->data;
        piVar19 = pMVar1->refcount;
        sVar30 = pMVar1->elemsize;
        local_1f8.elempack = pMVar1->elempack;
        local_1f8.allocator = pMVar1->allocator;
        uVar36._0_4_ = pMVar1->dims;
        uVar36._4_4_ = pMVar1->w;
        uVar37._0_4_ = pMVar1->h;
        uVar37._4_4_ = pMVar1->d;
        local_1f8.c = pMVar1->c;
        local_1f8.cstep = pMVar1->cstep;
        if (piVar19 == (int *)0x0) {
          piVar19 = (int *)0x0;
        }
        else {
          LOCK();
          *piVar19 = *piVar19 + 1;
          UNLOCK();
          LOCK();
          *piVar19 = *piVar19 + 1;
          UNLOCK();
          bVar35 = false;
        }
      }
      else {
        local_1f8.allocator = (Allocator *)0x0;
        local_1f8.elempack = 0;
        sVar30 = 0;
        piVar19 = (int *)0x0;
        local_1f8.data = (void *)0x0;
        local_1f8.c = 0;
        local_1f8.cstep = 0;
      }
      local_1f8.refcount._0_4_ = SUB84(piVar19,0);
      local_1f8.refcount._4_4_ = (uint)((ulong)piVar19 >> 0x20);
      local_1f8.elemsize._0_4_ = (int)sVar30;
      local_1f8.elemsize._4_4_ = (undefined4)(sVar30 >> 0x20);
      local_1f8.dims = (int)uVar36;
      local_1f8.w = (int)((ulong)uVar36 >> 0x20);
      local_1f8.h = (int)uVar37;
      local_1f8.d = (int)((ulong)uVar37 >> 0x20);
      if (!bVar35) {
        LOCK();
        *piVar19 = *piVar19 + -1;
        UNLOCK();
        if (*piVar19 == 0) {
          if (local_1f8.allocator == (Allocator *)0x0) {
LAB_004afc8d:
            if (local_1f8.data != (void *)0x0) {
              free(local_1f8.data);
            }
          }
          else {
            (*(local_1f8.allocator)->_vptr_Allocator[3])(local_1f8.allocator,local_1f8.data);
          }
        }
      }
    }
    broadcast_type_C = 0;
    if ((local_1f8.data != (void *)0x0) && ((long)local_1f8.c * local_1f8.cstep != 0)) {
      if (local_1f8.dims == 1) {
        broadcast_type_C = 4;
        if (local_1f8.w * local_1f8.elempack != uVar20) {
          broadcast_type_C = (uint)(local_1f8.w * local_1f8.elempack == uVar15);
        }
      }
      else {
        bVar35 = local_1f8.dims == 2;
        broadcast_type_C = 0;
        if (local_1f8.w == 1U && bVar35) {
          broadcast_type_C = (uint)(local_1f8.elempack * local_1f8.h == uVar15) * 2;
        }
        if ((local_1f8.w == 1U && bVar35 || bVar35) && (local_1f8.w == uVar20)) {
          if (local_1f8.elempack * local_1f8.h == uVar15) {
            broadcast_type_C = 3;
          }
          if (local_1f8.elempack * local_1f8.h == 1) {
            broadcast_type_C = 4;
          }
        }
      }
      if (*(float *)((long)&(this->CT_data).d + (long)this->_vptr_Gemm_x86_avx512[-3]) != 1.0) {
        local_188.cstep = 0;
        local_188.data = (void *)0x0;
        local_188.refcount._0_4_ = 0;
        local_188.refcount._4_4_ = 0;
        local_188.elemsize._0_4_ = 0;
        local_188.elemsize._4_4_ = 0;
        local_188.elempack = 0;
        local_188.allocator = (Allocator *)0x0;
        local_188.dims = 0;
        local_188.d = 0;
        local_188.c = 0;
        local_188.w = local_188.refcount._4_4_;
        local_188.h = (int)local_188.elemsize;
        Mat::create_like(&local_188,&local_1f8,opt->workspace_allocator);
        uVar25 = local_1f8.c * (int)local_1f8.cstep * local_1f8.elempack;
        if (0 < (int)uVar25) {
          pp_Var3 = this->_vptr_Gemm_x86_avx512;
          uVar23 = 0;
          do {
            *(float *)((long)local_188.data + uVar23 * 4) =
                 *(float *)((long)&(this->CT_data).d + (long)pp_Var3[-3]) *
                 *(float *)((long)local_1f8.data + uVar23 * 4);
            uVar23 = uVar23 + 1;
          } while (uVar25 != uVar23);
        }
        piVar19 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
        if (piVar19 != (int *)0x0) {
          LOCK();
          *piVar19 = *piVar19 + 1;
          UNLOCK();
        }
        piVar19 = (int *)CONCAT44(local_1f8.refcount._4_4_,local_1f8.refcount._0_4_);
        if (piVar19 != (int *)0x0) {
          LOCK();
          *piVar19 = *piVar19 + -1;
          UNLOCK();
          if (*piVar19 == 0) {
            if (local_1f8.allocator == (Allocator *)0x0) {
              if (local_1f8.data != (void *)0x0) {
                free(local_1f8.data);
              }
            }
            else {
              (*(local_1f8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
        piVar19 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
        local_1f8.data = local_188.data;
        local_1f8.refcount._0_4_ = local_188.refcount._0_4_;
        local_1f8.refcount._4_4_ = local_188.refcount._4_4_;
        local_1f8.elemsize._0_4_ = (int)local_188.elemsize;
        local_1f8.elemsize._4_4_ = local_188.elemsize._4_4_;
        local_1f8.elempack = local_188.elempack;
        local_1f8.allocator = local_188.allocator;
        local_1f8.dims = local_188.dims;
        local_1f8.w = local_188.w;
        local_1f8.h = local_188.h;
        local_1f8.d = local_188.d;
        local_1f8.c = local_188.c;
        local_1f8.cstep = local_188.cstep;
        if (piVar19 != (int *)0x0) {
          LOCK();
          *piVar19 = *piVar19 + -1;
          UNLOCK();
          if (*piVar19 == 0) {
            if (local_188.allocator == (Allocator *)0x0) {
              if (local_188.data != (void *)0x0) {
                free(local_188.data);
              }
            }
            else {
              (*(local_188.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
    }
  }
  else {
    if (&local_1f8 != &this->CT_data) {
      piVar19 = (this->CT_data).refcount;
      if (piVar19 != (int *)0x0) {
        LOCK();
        *piVar19 = *piVar19 + 1;
        UNLOCK();
      }
      local_1f8.data = (this->CT_data).data;
      piVar19 = (this->CT_data).refcount;
      local_1f8.refcount._0_4_ = SUB84(piVar19,0);
      local_1f8.refcount._4_4_ = (uint)((ulong)piVar19 >> 0x20);
      sVar30 = (this->CT_data).elemsize;
      local_1f8.elemsize._0_4_ = (int)sVar30;
      local_1f8.elemsize._4_4_ = (undefined4)(sVar30 >> 0x20);
      local_1f8.elempack = (this->CT_data).elempack;
      local_1f8.allocator = (this->CT_data).allocator;
      uVar5 = (this->CT_data).dims;
      uVar6 = (this->CT_data).w;
      uVar7 = (this->CT_data).h;
      uVar8 = (this->CT_data).d;
      local_1f8.c = (this->CT_data).c;
      local_1f8.cstep = (this->CT_data).cstep;
      p_Var13 = this->_vptr_Gemm_x86_avx512[-3];
      local_1f8.dims = uVar5;
      local_1f8.w = uVar6;
      local_1f8.h = uVar7;
      local_1f8.d = uVar8;
    }
    broadcast_type_C = *(uint *)(&this->field_0xf8 + (long)p_Var13);
  }
  p_Var13 = this->_vptr_Gemm_x86_avx512[-3];
  uVar25 = 1;
  if (opt->use_packing_layout == true) {
    uVar25 = uVar20;
    if (*(int *)(&this->field_0x108 + (long)p_Var13) == 0) {
      uVar25 = uVar15;
    }
    if ((uVar25 & 0xf) == 0) {
      uVar25 = 0x10;
    }
    else if ((uVar25 & 7) == 0) {
      uVar25 = 8;
    }
    else {
      uVar25 = (uint)((uVar25 & 3) == 0) * 3 + 1;
    }
  }
  if (*(uint *)(&this->field_0x100 + (long)p_Var13) != 0) {
    uVar25 = *(uint *)(&this->field_0x100 + (long)p_Var13);
  }
  local_38 = (ulong)uVar25;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  _w = uVar20;
  if (*(int *)(&this->field_0x108 + (long)p_Var13) != 0) {
    _w = uVar15;
    uVar15 = uVar20;
  }
  if (*(int *)(&this->field_0xfc + (long)p_Var13) == 0) {
    Mat::create(this_00,_w,(int)uVar15 / (int)uVar25,(ulong)(uVar25 * 4),uVar25,opt->blob_allocator)
    ;
  }
  else {
    Mat::create(this_00,_w,1,(int)uVar15 / (int)uVar25,(ulong)(uVar25 * 4),uVar25,
                opt->blob_allocator);
  }
  iVar12 = -100;
  if ((this_00->data == (void *)0x0) || ((long)this_00->c * this_00->cstep == 0)) goto LAB_004af960;
  iVar12 = this->nT;
  iVar18 = iVar12;
  if (iVar12 == 0) {
    iVar18 = opt->num_threads;
  }
  if (opt->num_threads != iVar12 && iVar12 != 0) {
    forward();
  }
  p_Var13 = this->_vptr_Gemm_x86_avx512[-3];
  iVar12 = *(int *)((long)&(this->CT_data).cstep + (long)(p_Var13 + 4));
  if (*(int *)((long)&(this->CT_data).cstep + (long)p_Var13) == 0) {
    pMVar16 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
    if (iVar12 == 0) {
      iVar12 = *(int *)((long)&(this->CT_data).c + (long)p_Var13);
      iVar22 = *(int *)(&(this->CT_data).field_0x3c + (long)p_Var13);
      local_1a0 = CONCAT44(local_1a0._4_4_,iVar12);
      if (iVar12 == 0) {
        iVar12 = pMVar16->elempack * (&pMVar16->h)[(ulong)(pMVar16->dims == 3) * 2];
        iVar29 = pMVar16->w;
      }
      else {
        iVar12 = pMVar16->w;
        iVar29 = pMVar16->elempack * (&pMVar16->h)[(ulong)(pMVar16->dims == 3) * 2];
      }
      if (iVar22 == 0) {
        uVar15 = pMVar16[1].w;
      }
      else {
        uVar15 = pMVar16[1].elempack * (&pMVar16[1].h)[(ulong)(pMVar16[1].dims == 3) * 2];
      }
      local_228 = (Mat *)(ulong)uVar15;
      local_1a8 = CONCAT44(local_1a8._4_4_,*(undefined4 *)(&this->field_0x108 + (long)p_Var13));
      get_optimal_tile_mnk
                (iVar12,uVar15,iVar29,*(int *)(&this->field_0x10c + (long)p_Var13),
                 *(int *)(&this->field_0x110 + (long)p_Var13),
                 *(int *)(&this->field_0x114 + (long)p_Var13),&TILE_K,&TILE_K_1,&TILE_K_2,iVar18);
      local_90 = (ulong)(uint)TILE_K;
      local_a0 = CONCAT44(local_a0._4_4_,(iVar12 + TILE_K + -1) / TILE_K);
      iVar12 = (iVar29 + TILE_K_2 + -1) / TILE_K_2;
      local_188.cstep = 0;
      local_188.data = (void *)0x0;
      local_188.refcount._0_4_ = 0;
      local_188.refcount._4_4_ = 0;
      local_188.elemsize._0_4_ = 0;
      local_188.elemsize._4_4_ = 0;
      local_188.elempack = 0;
      local_188.allocator = (Allocator *)0x0;
      local_188.dims = 0;
      local_188.w = 0;
      local_188.h = 0;
      local_188.d = 0;
      local_188.c = 0;
      Mat::create(&local_188,TILE_K_2 * TILE_K,iVar12,iVar18,4,opt->workspace_allocator);
      iVar10 = ((int)local_228 + TILE_K_1 + -1) / TILE_K_1;
      local_138.cstep = 0;
      local_138.data = (Mat *)0x0;
      local_138.refcount._0_4_ = 0;
      local_138.refcount._4_4_ = 0;
      local_138.elemsize._0_4_ = 0;
      local_138.elemsize._4_4_ = 0;
      local_138.elempack = 0;
      local_138.allocator = (Allocator *)0x0;
      local_138.dims = 0;
      local_138.w = 0;
      local_138.h = 0;
      local_138.d = 0;
      local_138.c = 0;
      local_238 = (ulong)(uint)TILE_K_2;
      local_208 = (ulong)(uint)TILE_K_1;
      Mat::create(&local_138,TILE_K_2 * TILE_K_1,iVar12,iVar10,4,opt->workspace_allocator);
      iVar10 = iVar10 * iVar12;
      if (0 < iVar10) {
        iVar21 = 0;
        do {
          iVar11 = (int)local_208;
          iVar27 = (iVar21 / iVar12) * iVar11;
          iVar26 = (int)local_238;
          iVar24 = (int)((long)iVar21 % (long)iVar12) * iVar26;
          iVar28 = (int)local_228 - iVar27;
          if (iVar11 < iVar28) {
            iVar28 = iVar11;
          }
          iVar11 = iVar29 - iVar24;
          if (iVar26 < iVar29 - iVar24) {
            iVar11 = iVar26;
          }
          pMVar17 = (Mat *)((long)(void **)local_138.data +
                           ((long)iVar21 % (long)iVar12 & 0xffffffffU) * (long)local_138.w *
                           CONCAT44(local_138.elemsize._4_4_,(int)local_138.elemsize) +
                           (long)(iVar21 / iVar12) * local_138.cstep *
                           CONCAT44(local_138.elemsize._4_4_,(int)local_138.elemsize));
          if (iVar22 == 0) {
            transpose_pack_B_tile(pMVar16 + 1,pMVar17,iVar27,iVar28,iVar24,iVar11);
          }
          else {
            pack_B_tile(pMVar16 + 1,pMVar17,iVar27,iVar28,iVar24,iVar11);
          }
          iVar21 = iVar21 + 1;
        } while (iVar10 != iVar21);
      }
      uVar23 = local_208;
      local_a8 = 0;
      _TILE_M = (Mat *)0x0;
      uStack_e0 = 0;
      uStack_dc = 0;
      local_d8 = 0;
      uStack_d4 = 0;
      local_d0 = 0;
      local_c8 = (Allocator *)0x0;
      iStack_c0 = 0;
      uStack_bc = 0;
      iStack_b8 = 0;
      uStack_b4._0_4_ = 0;
      uStack_b4._4_4_ = 0;
      if ((((int)local_1a8 != 0) || (broadcast_type_C == 3)) || ((int)local_238 < iVar29)) {
        Mat::create((Mat *)&TILE_M,(int)local_208 * (int)local_90,1,iVar18,4,
                    opt->workspace_allocator);
      }
      if (0 < (int)(uint)local_a0) {
        bVar35 = (int)local_1a8 == 0;
        local_190 = 0;
        pMVar17 = local_228;
        do {
          if ((int)local_1a0 == 0) {
            iVar12 = pMVar16->elempack * (&pMVar16->h)[(ulong)(pMVar16->dims == 3) * 2];
            iVar18 = pMVar16->w;
          }
          else {
            iVar12 = pMVar16->w;
            iVar18 = pMVar16->elempack * (&pMVar16->h)[(ulong)(pMVar16->dims == 3) * 2];
          }
          iVar29 = (int)local_90;
          iVar10 = iVar29 * (uint)local_190;
          iVar22 = iVar12 - iVar10;
          if (iVar29 < iVar12 - iVar10) {
            iVar22 = iVar29;
          }
          local_48 = 0;
          _TILE_N = (Mat *)0x0;
          uStack_80 = 0;
          uStack_7c = 0;
          local_78 = 0;
          uStack_74 = 0;
          local_70 = 0;
          iStack_58 = 0;
          uStack_54._0_4_ = 0;
          uStack_54._4_4_ = 0;
          local_68 = (Allocator *)0x0;
          iStack_60 = 0;
          uStack_5c = 0;
          if ((((int)local_1a8 != 0) || (broadcast_type_C == 3)) || ((int)local_238 < iVar18)) {
            iVar12 = get_omp_thread_num();
            uVar33 = CONCAT44(uStack_d4,local_d8);
            local_48 = ((long)(int)uStack_bc * (long)iStack_b8 * uVar33 + 0xf & 0xfffffffffffffff0)
                       / uVar33;
            if (iStack_c0 == 4) {
              local_48 = (long)(int)uStack_bc * (long)iStack_b8;
            }
            iStack_60 = iStack_c0 + -1;
            _TILE_N = (Mat *)((long)&_TILE_M->data + (long)iVar12 * uVar33 * local_a8);
            local_78 = local_d8;
            uStack_74 = uStack_d4;
            local_70 = local_d0;
            local_68 = local_c8;
            uStack_5c = uStack_bc;
            iStack_58 = iStack_b8;
            uStack_54._4_4_ = (int)uStack_b4;
            uStack_54._0_4_ = 1;
          }
          uStack_7c = 0;
          uStack_80 = 0;
          local_230 = _TILE_N;
          if (0 < (int)pMVar17) {
            iVar12 = 0;
            do {
              uVar15 = (int)pMVar17 - iVar12;
              local_220 = (ulong)uVar15;
              if ((int)uVar23 < (int)uVar15) {
                local_220 = uVar23 & 0xffffffff;
              }
              local_198 = &local_1f8;
              if (broadcast_type_C == 3) {
                pack_A_tile(&local_1f8,local_230,iVar10,iVar22,iVar12,(int)local_220);
                local_198 = (Mat *)&TILE_N;
              }
              if (0 < iVar18) {
                uVar23 = local_238;
                iVar29 = iVar18;
                iVar21 = 0;
                do {
                  iVar27 = (int)uVar23;
                  iVar28 = iVar29;
                  if (iVar27 < iVar29) {
                    iVar28 = iVar27;
                  }
                  iVar11 = get_omp_thread_num();
                  pvVar4 = local_138.data;
                  pMVar17 = (Mat *)(long)(iVar21 / iVar27);
                  pMVar31 = (Mat *)((long)local_188.data +
                                   (long)local_188.w *
                                   CONCAT44(local_188.elemsize._4_4_,(int)local_188.elemsize) *
                                   (long)pMVar17 +
                                   (long)iVar11 * local_188.cstep *
                                   CONCAT44(local_188.elemsize._4_4_,(int)local_188.elemsize));
                  lVar34 = (long)local_138.w;
                  lVar32 = (long)(iVar12 / (int)local_208) * local_138.cstep;
                  uVar33 = CONCAT44(local_138.elemsize._4_4_,(int)local_138.elemsize);
                  uVar14 = uVar33;
                  if (iVar12 == 0) {
                    local_218 = uVar33;
                    local_210 = pMVar17;
                    if ((int)local_1a0 == 0) {
                      pack_A_tile(pMVar16,pMVar31,iVar10,iVar22,iVar21,iVar28);
                      uVar14 = local_218;
                      uVar23 = local_238;
                      pMVar17 = local_210;
                    }
                    else {
                      transpose_pack_A_tile(pMVar16,pMVar31,iVar10,iVar22,iVar21,iVar28);
                      uVar14 = local_218;
                      uVar23 = local_238;
                      pMVar17 = local_210;
                    }
                  }
                  iVar27 = iVar21 + (int)uVar23;
                  gemm_transB_packed_tile
                            (pMVar31,(Mat *)((long)(void **)pvVar4 +
                                            lVar34 * uVar14 * (long)pMVar17 + lVar32 * uVar33),
                             local_198,local_230,this_00,broadcast_type_C,iVar10,iVar22,iVar12,
                             (int)local_220,iVar21,iVar28,iVar18 <= iVar27 && bVar35);
                  iVar29 = iVar29 - (int)uVar23;
                  iVar21 = iVar27;
                } while (iVar27 < iVar18);
              }
              if ((int)local_1a8 != 0) {
                transpose_unpack_output_tile(local_230,this_00,iVar10,iVar22,iVar12,(int)local_220);
              }
              iVar12 = iVar12 + (int)local_208;
              uVar23 = local_208;
              pMVar17 = local_228;
            } while (iVar12 < (int)local_228);
          }
          uVar15 = (int)local_190 + 1;
          local_190 = (ulong)uVar15;
        } while (uVar15 != (uint)local_a0);
      }
      piVar19 = (int *)CONCAT44(uStack_dc,uStack_e0);
      if (piVar19 != (int *)0x0) {
        LOCK();
        *piVar19 = *piVar19 + -1;
        UNLOCK();
        if (*piVar19 == 0) {
          if (local_c8 == (Allocator *)0x0) {
            if (_TILE_M != (Mat *)0x0) {
              free(_TILE_M);
            }
          }
          else {
            (*local_c8->_vptr_Allocator[3])();
          }
        }
      }
      piVar19 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
      if (piVar19 != (int *)0x0) {
        LOCK();
        *piVar19 = *piVar19 + -1;
        UNLOCK();
        if (*piVar19 == 0) {
          if (local_138.allocator == (Allocator *)0x0) {
            if ((Mat *)local_138.data != (Mat *)0x0) {
              free(local_138.data);
            }
          }
          else {
            (*(local_138.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar19 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
      if (piVar19 != (int *)0x0) {
        LOCK();
        *piVar19 = *piVar19 + -1;
        UNLOCK();
        if (*piVar19 == 0) {
          if (local_188.allocator == (Allocator *)0x0) goto joined_r0x004af8f6;
          (*(local_188.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    else {
      iVar12 = *(int *)((long)&(this->CT_data).c + (long)p_Var13);
      local_228 = (Mat *)CONCAT44(local_228._4_4_,*(int *)(&this->field_0xf0 + (long)p_Var13));
      iVar22 = *(int *)(&this->field_0xf4 + (long)p_Var13);
      local_218 = CONCAT44(local_218._4_4_,iVar12);
      if (iVar12 == 0) {
        iVar12 = pMVar16->elempack * (&pMVar16->h)[(ulong)(pMVar16->dims == 3) * 2];
      }
      else {
        iVar12 = pMVar16->w;
      }
      local_1a0 = CONCAT44(local_1a0._4_4_,*(undefined4 *)(&this->field_0x108 + (long)p_Var13));
      get_optimal_tile_mnk
                (iVar12,*(int *)(&this->field_0xf0 + (long)p_Var13),iVar22,
                 *(int *)(&this->field_0x10c + (long)p_Var13),
                 *(int *)(&this->field_0x110 + (long)p_Var13),
                 *(int *)(&this->field_0x114 + (long)p_Var13),&TILE_N,&TILE_K,&TILE_K_1,iVar18);
      local_a0 = (ulong)_TILE_N & 0xffffffff;
      local_190 = CONCAT44(local_190._4_4_,(iVar12 + TILE_N + -1) / TILE_N);
      local_238 = (ulong)(uint)TILE_K_1;
      local_188.cstep = 0;
      local_188.data = (void *)0x0;
      local_188.refcount._0_4_ = 0;
      local_188.refcount._4_4_ = 0;
      local_188.elemsize._0_4_ = 0;
      local_188.elemsize._4_4_ = 0;
      local_188.elempack = 0;
      local_188.allocator = (Allocator *)0x0;
      local_188.dims = 0;
      local_188.w = 0;
      local_188.h = 0;
      local_188.d = 0;
      local_188.c = 0;
      Mat::create(&local_188,TILE_K_1 * TILE_N,(iVar22 + TILE_K_1 + -1) / TILE_K_1,iVar18,4,
                  opt->workspace_allocator);
      local_138.cstep = 0;
      local_138.data = (Mat *)0x0;
      local_138.refcount._0_4_ = 0;
      local_138.refcount._4_4_ = 0;
      local_138.elemsize._0_4_ = 0;
      local_138.elemsize._4_4_ = 0;
      local_138.elempack = 0;
      local_138.allocator = (Allocator *)0x0;
      local_138.dims = 0;
      local_138.w = 0;
      local_138.h = 0;
      local_138.d = 0;
      local_138.c = 0;
      if ((((int)local_1a0 != 0) || (broadcast_type_C == 3)) || ((int)local_238 < iVar22)) {
        Mat::create(&local_138,TILE_K * (uint)local_a0,1,iVar18,4,opt->workspace_allocator);
      }
      if (0 < (int)(uint)local_190) {
        local_208 = CONCAT71(local_208._1_7_,(int)local_1a0 == 0);
        local_1a8 = 0;
        uVar23 = local_238;
        iVar12 = (int)local_228;
        do {
          if ((int)local_218 == 0) {
            iVar18 = pMVar16->elempack * (&pMVar16->h)[(ulong)(pMVar16->dims == 3) * 2];
            iVar22 = pMVar16->w;
          }
          else {
            iVar18 = pMVar16->w;
            iVar22 = pMVar16->elempack * (&pMVar16->h)[(ulong)(pMVar16->dims == 3) * 2];
          }
          iVar10 = (int)local_a0;
          iVar21 = iVar10 * (int)local_1a8;
          iVar29 = iVar18 - iVar21;
          if (iVar10 < iVar18 - iVar21) {
            iVar29 = iVar10;
          }
          local_a8 = 0;
          _TILE_M = (Mat *)0x0;
          uStack_e0 = 0;
          uStack_dc = 0;
          local_d8 = 0;
          uStack_d4 = 0;
          local_d0 = 0;
          iStack_b8 = 0;
          uStack_b4._0_4_ = 0;
          uStack_b4._4_4_ = 0;
          local_c8 = (Allocator *)0x0;
          iStack_c0 = 0;
          uStack_bc = 0;
          if ((((int)local_1a0 != 0) || (broadcast_type_C == 3)) || ((int)uVar23 < iVar22)) {
            iVar18 = get_omp_thread_num();
            uVar33 = CONCAT44(local_138.elemsize._4_4_,(int)local_138.elemsize);
            local_a8 = ((long)local_138.w * (long)local_138.h * uVar33 + 0xf & 0xfffffffffffffff0) /
                       uVar33;
            if (local_138.dims == 4) {
              local_a8 = (long)local_138.w * (long)local_138.h;
            }
            iStack_c0 = local_138.dims + -1;
            _TILE_M = (Mat *)((long)(void **)local_138.data +
                             (long)iVar18 * uVar33 * local_138.cstep);
            local_d8 = (int)local_138.elemsize;
            uStack_d4 = local_138.elemsize._4_4_;
            local_d0 = local_138.elempack;
            local_c8 = local_138.allocator;
            uStack_bc = local_138.w;
            iStack_b8 = local_138.h;
            uStack_b4._4_4_ = local_138.d;
            uStack_b4._0_4_ = 1;
          }
          uStack_dc = 0;
          uStack_e0 = 0;
          local_230 = _TILE_M;
          if (0 < iVar12) {
            iVar18 = 0;
            do {
              uVar15 = iVar12 - iVar18;
              if (TILE_K < iVar12 - iVar18) {
                uVar15 = TILE_K;
              }
              local_220 = (ulong)uVar15;
              local_198 = &local_1f8;
              if (broadcast_type_C == 3) {
                pack_A_tile(&local_1f8,local_230,iVar21,iVar29,iVar18,uVar15);
                local_198 = (Mat *)&TILE_M;
              }
              if (0 < iVar22) {
                iVar12 = iVar22;
                iVar10 = 0;
                do {
                  iVar27 = (int)uVar23;
                  iVar28 = iVar12;
                  if (iVar27 < iVar12) {
                    iVar28 = iVar27;
                  }
                  iVar11 = get_omp_thread_num();
                  pMVar17 = (Mat *)(long)(iVar10 / iVar27);
                  pMVar31 = (Mat *)((long)local_188.data +
                                   (long)local_188.w *
                                   CONCAT44(local_188.elemsize._4_4_,(int)local_188.elemsize) *
                                   (long)pMVar17 +
                                   (long)iVar11 * local_188.cstep *
                                   CONCAT44(local_188.elemsize._4_4_,(int)local_188.elemsize));
                  iVar27 = (this->BT_data).w;
                  sVar30 = (this->BT_data).cstep;
                  sVar2 = (this->BT_data).elemsize;
                  pvVar4 = (this->BT_data).data;
                  if (iVar18 == 0) {
                    local_210 = pMVar17;
                    if ((int)local_218 == 0) {
                      pack_A_tile(pMVar16,pMVar31,iVar21,iVar29,iVar10,iVar28);
                      uVar23 = local_238;
                      pMVar17 = local_210;
                    }
                    else {
                      transpose_pack_A_tile(pMVar16,pMVar31,iVar21,iVar29,iVar10,iVar28);
                      uVar23 = local_238;
                      pMVar17 = local_210;
                    }
                  }
                  iVar11 = iVar10 + (int)uVar23;
                  gemm_transB_packed_tile
                            (pMVar31,(Mat *)((long)pvVar4 +
                                            (long)iVar27 * sVar2 * (long)pMVar17 +
                                            (long)(iVar18 / TILE_K) * sVar30 * sVar2),local_198,
                             local_230,this_00,broadcast_type_C,iVar21,iVar29,iVar18,(int)local_220,
                             iVar10,iVar28,(bool)(iVar22 <= iVar11 & (byte)local_208));
                  iVar12 = iVar12 - (int)uVar23;
                  iVar10 = iVar11;
                } while (iVar11 < iVar22);
              }
              if ((int)local_1a0 != 0) {
                transpose_unpack_output_tile(local_230,this_00,iVar21,iVar29,iVar18,(int)local_220);
              }
              iVar18 = iVar18 + TILE_K;
              iVar12 = (int)local_228;
            } while (iVar18 < (int)local_228);
          }
          uVar15 = (int)local_1a8 + 1;
          local_1a8 = (ulong)uVar15;
        } while (uVar15 != (uint)local_190);
      }
      piVar19 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
      if (piVar19 != (int *)0x0) {
        LOCK();
        *piVar19 = *piVar19 + -1;
        UNLOCK();
        if (*piVar19 == 0) {
          if (local_138.allocator == (Allocator *)0x0) {
            if ((Mat *)local_138.data != (Mat *)0x0) {
              free(local_138.data);
            }
          }
          else {
            (*(local_138.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar19 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
      if (piVar19 != (int *)0x0) {
        LOCK();
        *piVar19 = *piVar19 + -1;
        UNLOCK();
        if (*piVar19 == 0) {
          if (local_188.allocator == (Allocator *)0x0) goto joined_r0x004af8f6;
          (*(local_188.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else {
    uVar15 = *(uint *)(&this->field_0xec + (long)p_Var13);
    local_1a0 = (ulong)uVar15;
    iVar22 = *(int *)(&this->field_0x108 + (long)p_Var13);
    if (iVar12 == 0) {
      pMVar16 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      iVar12 = *(int *)(&(this->CT_data).field_0x3c + (long)p_Var13);
      iVar29 = *(int *)(&this->field_0xf4 + (long)p_Var13);
      if (iVar12 == 0) {
        uVar20 = pMVar16->w;
      }
      else {
        uVar20 = pMVar16->elempack * (&pMVar16->h)[(ulong)(pMVar16->dims == 3) * 2];
      }
      get_optimal_tile_mnk
                (uVar15,uVar20,iVar29,*(int *)(&this->field_0x10c + (long)p_Var13),
                 *(int *)(&this->field_0x110 + (long)p_Var13),
                 *(int *)(&this->field_0x114 + (long)p_Var13),&TILE_N,&TILE_K,&TILE_K_1,iVar18);
      local_228 = (Mat *)((ulong)_TILE_N & 0xffffffff);
      uVar15 = (int)(uVar15 + TILE_N + -1) / TILE_N;
      iVar10 = (int)(TILE_K + uVar20 + -1) / TILE_K;
      uVar23 = (ulong)(uint)TILE_K_1;
      iVar21 = (iVar29 + TILE_K_1 + -1) / TILE_K_1;
      local_188.cstep = 0;
      local_188.data = (void *)0x0;
      local_188.refcount._0_4_ = 0;
      local_188.refcount._4_4_ = 0;
      local_188.elemsize._0_4_ = 0;
      local_188.elemsize._4_4_ = 0;
      local_188.elempack = 0;
      local_188.allocator = (Allocator *)0x0;
      local_188.dims = 0;
      local_188.w = 0;
      local_188.h = 0;
      local_188.d = 0;
      local_188.c = 0;
      Mat::create(&local_188,TILE_K_1 * TILE_K,iVar21,iVar10,4,opt->workspace_allocator);
      iVar10 = iVar10 * iVar21;
      local_218 = (ulong)uVar20;
      if (0 < iVar10) {
        iVar28 = 0;
        do {
          iVar11 = (iVar28 / iVar21) * TILE_K;
          iVar24 = (int)((long)iVar28 % (long)iVar21) * TILE_K_1;
          iVar27 = (int)local_218 - iVar11;
          if (TILE_K < iVar27) {
            iVar27 = TILE_K;
          }
          iVar26 = iVar29 - iVar24;
          if (TILE_K_1 < iVar29 - iVar24) {
            iVar26 = TILE_K_1;
          }
          pMVar17 = (Mat *)((long)local_188.data +
                           ((long)iVar28 % (long)iVar21 & 0xffffffffU) * (long)local_188.w *
                           CONCAT44(local_188.elemsize._4_4_,(int)local_188.elemsize) +
                           (long)(iVar28 / iVar21) * local_188.cstep *
                           CONCAT44(local_188.elemsize._4_4_,(int)local_188.elemsize));
          if (iVar12 == 0) {
            transpose_pack_B_tile(pMVar16,pMVar17,iVar11,iVar27,iVar24,iVar26);
          }
          else {
            pack_B_tile(pMVar16,pMVar17,iVar11,iVar27,iVar24,iVar26);
          }
          iVar28 = iVar28 + 1;
        } while (iVar10 != iVar28);
      }
      local_138.cstep = 0;
      local_1a8 = CONCAT71(local_1a8._1_7_,
                           iVar22 != 0 || (broadcast_type_C == 3 || TILE_K_1 < iVar29));
      local_138.data = (Mat *)0x0;
      local_138.refcount._0_4_ = 0;
      local_138.refcount._4_4_ = 0;
      local_138.elemsize._0_4_ = 0;
      local_138.elemsize._4_4_ = 0;
      local_138.elempack = 0;
      local_138.allocator = (Allocator *)0x0;
      local_138.dims = 0;
      local_138.w = 0;
      local_138.h = 0;
      local_138.d = 0;
      local_138.c = 0;
      if (iVar22 != 0 || (broadcast_type_C == 3 || TILE_K_1 < iVar29)) {
        Mat::create(&local_138,TILE_K * (int)local_228,1,iVar18,4,opt->workspace_allocator);
      }
      if (0 < (int)uVar15) {
        local_190 = (ulong)uVar15;
        uVar14 = 0;
        local_238 = CONCAT71(local_238._1_7_,iVar22 == 0);
        uVar33 = local_218;
        local_208 = uVar23;
        do {
          iVar18 = (int)local_228;
          iVar10 = iVar18 * (int)uVar14;
          iVar12 = (int)local_1a0 - iVar10;
          if (iVar18 < iVar12) {
            iVar12 = iVar18;
          }
          local_a8 = 0;
          _TILE_M = (Mat *)0x0;
          uStack_e0 = 0;
          uStack_dc = 0;
          local_d8 = 0;
          uStack_d4 = 0;
          local_d0 = 0;
          iStack_b8 = 0;
          uStack_b4._0_4_ = 0;
          uStack_b4._4_4_ = 0;
          local_c8 = (Allocator *)0x0;
          iStack_c0 = 0;
          uStack_bc = 0;
          local_220 = uVar14;
          if ((char)local_1a8 != '\0') {
            iVar18 = get_omp_thread_num();
            uVar14 = CONCAT44(local_138.elemsize._4_4_,(int)local_138.elemsize);
            local_a8 = ((long)local_138.w * (long)local_138.h * uVar14 + 0xf & 0xfffffffffffffff0) /
                       uVar14;
            if (local_138.dims == 4) {
              local_a8 = (long)local_138.w * (long)local_138.h;
            }
            iStack_c0 = local_138.dims + -1;
            _TILE_M = (Mat *)((long)(void **)local_138.data +
                             (long)iVar18 * uVar14 * local_138.cstep);
            local_d8 = (int)local_138.elemsize;
            uStack_d4 = local_138.elemsize._4_4_;
            local_d0 = local_138.elempack;
            local_c8 = local_138.allocator;
            uStack_bc = local_138.w;
            iStack_b8 = local_138.h;
            uStack_b4._4_4_ = local_138.d;
            uStack_b4._0_4_ = 1;
          }
          uStack_dc = 0;
          uStack_e0 = 0;
          if (0 < (int)uVar33) {
            iVar18 = 0;
            local_210 = _TILE_M;
            do {
              iVar21 = (int)uVar33 - iVar18;
              if (TILE_K < iVar21) {
                iVar21 = TILE_K;
              }
              pMVar16 = &local_1f8;
              if (broadcast_type_C == 3) {
                pack_A_tile(&local_1f8,local_210,iVar10,iVar12,iVar18,iVar21);
                pMVar16 = (Mat *)&TILE_M;
              }
              pMVar17 = local_210;
              bVar9 = (byte)local_238;
              if (0 < iVar29) {
                local_230 = (Mat *)(long)(iVar18 / TILE_K);
                local_198 = pMVar16;
                iVar28 = iVar29;
                iVar27 = 0;
                do {
                  iVar24 = (int)uVar23;
                  iVar11 = iVar28;
                  if (iVar24 < iVar28) {
                    iVar11 = iVar24;
                  }
                  iVar28 = -(iVar24 - iVar28);
                  sVar30 = (this->AT_data).elemsize;
                  iVar26 = iVar27 + iVar24;
                  gemm_transB_packed_tile
                            ((Mat *)((long)(this->AT_data).data +
                                    (long)(this->AT_data).w * sVar30 * (long)(iVar27 / iVar24) +
                                    (this->AT_data).cstep * local_220 * sVar30),
                             (Mat *)((long)local_188.data +
                                    (long)local_188.w *
                                    CONCAT44(local_188.elemsize._4_4_,(int)local_188.elemsize) *
                                    (long)(iVar27 / iVar24) +
                                    local_188.cstep * (long)local_230 *
                                    CONCAT44(local_188.elemsize._4_4_,(int)local_188.elemsize)),
                             local_198,pMVar17,this_00,broadcast_type_C,iVar10,iVar12,iVar18,iVar21,
                             iVar27,iVar11,(bool)(iVar29 <= iVar26 & bVar9));
                  uVar23 = local_208;
                  iVar27 = iVar26;
                } while (iVar26 < iVar29);
              }
              if (iVar22 != 0) {
                transpose_unpack_output_tile(local_210,this_00,iVar10,iVar12,iVar18,iVar21);
              }
              iVar18 = iVar18 + TILE_K;
              uVar33 = local_218;
            } while (iVar18 < (int)local_218);
          }
          uVar14 = local_220 + 1;
        } while (uVar14 != local_190);
      }
      piVar19 = (int *)CONCAT44(local_138.refcount._4_4_,local_138.refcount._0_4_);
      if (piVar19 != (int *)0x0) {
        LOCK();
        *piVar19 = *piVar19 + -1;
        UNLOCK();
        if (*piVar19 == 0) {
          if (local_138.allocator == (Allocator *)0x0) {
            if ((Mat *)local_138.data != (Mat *)0x0) {
              free(local_138.data);
            }
          }
          else {
            (*(local_138.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      piVar19 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
      if (piVar19 != (int *)0x0) {
        LOCK();
        *piVar19 = *piVar19 + -1;
        UNLOCK();
        if (*piVar19 == 0) {
          if (local_188.allocator == (Allocator *)0x0) goto joined_r0x004af8f6;
          (*(local_188.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    else {
      iVar12 = *(int *)(&this->field_0xf0 + (long)p_Var13);
      iVar29 = *(int *)(&this->field_0xf4 + (long)p_Var13);
      get_optimal_tile_mnk
                (uVar15,iVar12,iVar29,*(int *)(&this->field_0x10c + (long)p_Var13),
                 *(int *)(&this->field_0x110 + (long)p_Var13),
                 *(int *)(&this->field_0x114 + (long)p_Var13),&TILE_M,&TILE_N,&TILE_K,iVar18);
      local_218 = (ulong)_TILE_M & 0xffffffff;
      uVar23 = (long)(int)(uVar15 + TILE_M + -1) / (long)TILE_M;
      local_188.cstep = 0;
      local_188.data = (void *)0x0;
      local_188.refcount._0_4_ = 0;
      local_188.refcount._4_4_ = 0;
      local_188.elemsize._0_4_ = 0;
      local_188.elemsize._4_4_ = 0;
      local_188.elempack = 0;
      local_188.allocator = (Allocator *)0x0;
      local_188.dims = 0;
      local_188.w = 0;
      local_188.h = 0;
      local_188.d = 0;
      local_188.c = 0;
      local_238 = CONCAT71(local_238._1_7_,iVar22 != 0 || (broadcast_type_C == 3 || TILE_K < iVar29)
                          );
      if (iVar22 != 0 || (broadcast_type_C == 3 || TILE_K < iVar29)) {
        Mat::create(&local_188,TILE_N * TILE_M,1,iVar18,4,opt->workspace_allocator);
      }
      if (0 < (int)uVar23) {
        local_198 = (Mat *)CONCAT71(local_198._1_7_,iVar22 == 0);
        pMVar16 = (Mat *)0x0;
        local_208 = CONCAT44(local_208._4_4_,TILE_N);
        local_228 = (Mat *)(uVar23 & 0xffffffff);
        do {
          iVar10 = (int)local_218;
          iVar21 = iVar10 * (int)pMVar16;
          iVar18 = (int)local_1a0 - iVar21;
          if (iVar10 < iVar18) {
            iVar18 = iVar10;
          }
          local_138.cstep = 0;
          local_138.data = (Mat *)0x0;
          local_138.refcount._0_4_ = 0;
          local_138.refcount._4_4_ = 0;
          local_138.elemsize._0_4_ = 0;
          local_138.elemsize._4_4_ = 0;
          local_138.elempack = 0;
          local_138.h = 0;
          local_138.d = 0;
          local_138.c = 0;
          local_138.allocator = (Allocator *)0x0;
          local_138.dims = 0;
          local_138.w = 0;
          local_210 = pMVar16;
          if ((byte)local_238 != '\0') {
            iVar10 = get_omp_thread_num();
            uVar23 = CONCAT44(local_188.elemsize._4_4_,(int)local_188.elemsize);
            local_138.cstep =
                 ((long)local_188.w * (long)local_188.h * uVar23 + 0xf & 0xfffffffffffffff0) /
                 uVar23;
            if (local_188.dims == 4) {
              local_138.cstep = (long)local_188.w * (long)local_188.h;
            }
            local_138.dims = local_188.dims + -1;
            local_138.data =
                 (void *)((long)iVar10 * uVar23 * local_188.cstep + (long)local_188.data);
            local_138.elemsize._0_4_ = (int)local_188.elemsize;
            local_138.elemsize._4_4_ = local_188.elemsize._4_4_;
            local_138.elempack = local_188.elempack;
            local_138.allocator = local_188.allocator;
            local_138.w = local_188.w;
            local_138.h = local_188.h;
            local_138.c = local_188.d;
            local_138.d = 1;
          }
          local_138.refcount._4_4_ = 0;
          local_138.refcount._0_4_ = 0;
          if (0 < iVar12) {
            iVar10 = 0;
            local_230 = (Mat *)local_138.data;
            do {
              iVar28 = iVar12 - iVar10;
              if ((int)local_208 < iVar12 - iVar10) {
                iVar28 = (int)local_208;
              }
              pMVar16 = &local_1f8;
              if (broadcast_type_C == 3) {
                pack_A_tile(&local_1f8,local_230,iVar21,iVar18,iVar10,iVar28);
                pMVar16 = &local_138;
              }
              pMVar31 = local_210;
              pMVar17 = local_230;
              if (0 < iVar29) {
                local_220 = (ulong)(iVar10 / (int)local_208);
                iVar27 = iVar29;
                iVar11 = 0;
                do {
                  iVar24 = iVar27;
                  if (TILE_K < iVar27) {
                    iVar24 = TILE_K;
                  }
                  iVar27 = -(TILE_K - iVar27);
                  sVar30 = (this->AT_data).elemsize;
                  sVar2 = (this->BT_data).elemsize;
                  iVar26 = iVar11 + TILE_K;
                  gemm_transB_packed_tile
                            ((Mat *)((long)(this->AT_data).data +
                                    (long)(this->AT_data).w * sVar30 * (long)(iVar11 / TILE_K) +
                                    (this->AT_data).cstep * (long)pMVar31 * sVar30),
                             (Mat *)((long)(this->BT_data).data +
                                    (long)(this->BT_data).w * sVar2 * (long)(iVar11 / TILE_K) +
                                    (this->BT_data).cstep * local_220 * sVar2),pMVar16,pMVar17,
                             this_00,broadcast_type_C,iVar21,iVar18,iVar10,iVar28,iVar11,iVar24,
                             (bool)(iVar29 <= iVar26 & (byte)local_198));
                  iVar11 = iVar26;
                } while (iVar26 < iVar29);
              }
              if (iVar22 != 0) {
                transpose_unpack_output_tile(local_230,this_00,iVar21,iVar18,iVar10,iVar28);
              }
              iVar10 = iVar10 + (int)local_208;
            } while (iVar10 < iVar12);
          }
          pMVar16 = (Mat *)((long)&local_210->data + 1);
        } while (pMVar16 != local_228);
      }
      piVar19 = (int *)CONCAT44(local_188.refcount._4_4_,local_188.refcount._0_4_);
      if (piVar19 != (int *)0x0) {
        LOCK();
        *piVar19 = *piVar19 + -1;
        UNLOCK();
        if (*piVar19 == 0) {
          if (local_188.allocator == (Allocator *)0x0) {
joined_r0x004af8f6:
            if (local_188.data != (void *)0x0) {
              free(local_188.data);
            }
          }
          else {
            (*(local_188.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
  }
  pp_Var3 = this->_vptr_Gemm_x86_avx512;
  iVar12 = 0;
  if ((*(float *)((long)&(this->CT_data).h + (long)pp_Var3[-3]) != 1.0) &&
     (uVar15 = (int)local_38 * (int)this_00->cstep * this_00->c, iVar12 = 0, 0 < (int)uVar15)) {
    pvVar4 = this_00->data;
    iVar12 = 0;
    uVar23 = 0;
    do {
      *(float *)((long)pvVar4 + uVar23 * 4) =
           *(float *)((long)pvVar4 + uVar23 * 4) *
           *(float *)((long)&(this->CT_data).h + (long)pp_Var3[-3]);
      uVar23 = uVar23 + 1;
    } while (uVar15 != uVar23);
  }
LAB_004af960:
  piVar19 = (int *)CONCAT44(local_1f8.refcount._4_4_,local_1f8.refcount._0_4_);
  if (piVar19 != (int *)0x0) {
    LOCK();
    *piVar19 = *piVar19 + -1;
    UNLOCK();
    if (*piVar19 == 0) {
      if (local_1f8.allocator == (Allocator *)0x0) {
        if (local_1f8.data != (void *)0x0) {
          free(local_1f8.data);
        }
      }
      else {
        (*(local_1f8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar12;
}

Assistant:

int Gemm_x86_avx512::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    int M;
    int N;
    if (constantA && constantB)
    {
        M = constantM;
        N = constantN;
    }
    else if (constantA)
    {
        const Mat& B = bottom_blobs[0];
        M = constantM;
        N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;
    }
    else if (constantB)
    {
        const Mat& A = bottom_blobs[0];
        M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        N = constantN;
    }
    else
    {
        const Mat& A = bottom_blobs[0];
        const Mat& B = bottom_blobs[1];
        M = transA ? A.w : (A.dims == 3 ? A.c : A.h) * A.elempack;
        N = transB ? (B.dims == 3 ? B.c : B.h) * B.elempack : B.w;
    }

    Mat C;
    int broadcast_type_C = 0;
    if (constantC)
    {
        C = CT_data;
        broadcast_type_C = constant_broadcast_type_C;
    }
    else
    {
        if (constantA && constantB)
        {
            C = bottom_blobs.size() == 1 ? bottom_blobs[0] : Mat();
        }
        else if (constantA)
        {
            C = bottom_blobs.size() == 2 ? bottom_blobs[1] : Mat();
        }
        else if (constantB)
        {
            C = bottom_blobs.size() == 2 ? bottom_blobs[1] : Mat();
        }
        else
        {
            C = bottom_blobs.size() == 3 ? bottom_blobs[2] : Mat();
        }

        if (!C.empty())
        {
            if (C.dims == 1 && C.w == 1)
            {
                // scalar
                broadcast_type_C = 0;
            }
            if (C.dims == 1 && C.w * C.elempack == M)
            {
                // M
                // auto broadcast from h to w is the ncnn-style convention
                broadcast_type_C = 1;
            }
            if (C.dims == 1 && C.w * C.elempack == N)
            {
                // N
                broadcast_type_C = 4;
            }
            if (C.dims == 2 && C.w == 1 && C.h * C.elempack == M)
            {
                // Mx1
                broadcast_type_C = 2;
            }
            if (C.dims == 2 && C.w == N && C.h * C.elempack == M)
            {
                // MxN
                broadcast_type_C = 3;
            }
            if (C.dims == 2 && C.w == N && C.h * C.elempack == 1)
            {
                // 1xN
                broadcast_type_C = 4;
            }

            // pre-multiply C with beta
            if (beta != 1.f)
            {
                Mat C2;
                C2.create_like(C, opt.workspace_allocator);

                const int size = C.total() * C.elempack;
                for (int i = 0; i < size; i++)
                {
                    C2[i] = C[i] * beta;
                }

                C = C2;
            }
        }
    }

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        int outh = output_transpose ? N : M;
#if __AVX512F__
        out_elempack = outh % 16 == 0 ? 16 : outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = outh % 8 == 0 ? 8 : outh % 4 == 0 ? 4 : 1;
#else
        out_elempack = outh % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    if (output_elempack)
        out_elempack = output_elempack;
    size_t out_elemsize = 4u * out_elempack;

    Mat& top_blob = top_blobs[0];
    if (output_transpose)
    {
        if (output_N1M)
            top_blob.create(M, 1, N / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        else
            top_blob.create(M, N / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    else
    {
        if (output_N1M)
            top_blob.create(N, 1, M / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
        else
            top_blob.create(N, M / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    int _nT = nT ? nT : opt.num_threads;
    if (nT != 0 && opt.num_threads != nT)
    {
        // force num_threads the same as in create_pipeline
        // so we could use pre-packed A/B from the same tile config
        NCNN_LOGE("opt.num_threads %d changed, gemm will use load-time value %d", opt.num_threads, nT);
    }

    int ret = 0;
    if (constantA && constantB)
    {
        ret = gemm_AT_BT_x86(AT_data, BT_data, C, top_blob, broadcast_type_C, constantM, constantN, constantK, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else if (constantA)
    {
        const Mat& B = bottom_blobs[0];
        ret = gemm_AT_x86(AT_data, B, C, top_blob, broadcast_type_C, constantM, constantK, transB, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else if (constantB)
    {
        const Mat& A = bottom_blobs[0];
        ret = gemm_BT_x86(A, BT_data, C, top_blob, broadcast_type_C, constantN, constantK, transA, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }
    else
    {
        const Mat& A = bottom_blobs[0];
        const Mat& B = bottom_blobs[1];
        ret = gemm_x86(A, B, C, top_blob, broadcast_type_C, transA, transB, output_transpose, constant_TILE_M, constant_TILE_N, constant_TILE_K, _nT, opt);
    }

    // multiply top_blob with alpha
    if (alpha != 1.f)
    {
        const int size = top_blob.total() * out_elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < size; i++)
        {
            top_blob[i] *= alpha;
        }
    }

    return ret;
}